

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray
          (TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*> *this)

{
  FIntermissionAction *pFVar1;
  ulong uVar2;
  
  if ((this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>).Count != 0) {
    uVar2 = 0;
    do {
      pFVar1 = (this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>).Array[uVar2];
      if (pFVar1 != (FIntermissionAction *)0x0) {
        (*pFVar1->_vptr_FIntermissionAction[1])();
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>).Count);
  }
  TArray<FIntermissionAction_*,_FIntermissionAction_*>::~TArray
            (&this->super_TArray<FIntermissionAction_*,_FIntermissionAction_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}